

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void google::protobuf::UnknownFieldSet::MergeToInternalMetadata
               (UnknownFieldSet *other,InternalMetadata *metadata)

{
  UnknownFieldSet *this;
  
  this = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                   (metadata);
  MergeFrom(this,other);
  return;
}

Assistant:

void UnknownFieldSet::MergeToInternalMetadata(
    const UnknownFieldSet& other, internal::InternalMetadata* metadata) {
  metadata->mutable_unknown_fields<UnknownFieldSet>()->MergeFrom(other);
}